

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

void henson_load_float(char *name,float *x)

{
  NameMap *this;
  float *pfVar1;
  allocator local_79;
  string local_78;
  Value local_58;
  
  this = namemap;
  if (namemap != (NameMap *)0x0) {
    std::__cxx11::string::string((string *)&local_78,name,&local_79);
    henson::NameMap::get(&local_58,this,&local_78);
    pfVar1 = mpark::detail::
             generic_get<3ul,mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>
                       (&local_58);
    *x = *pfVar1;
    mpark::detail::
    destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::destroy((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
               *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void
henson_load_float(const char* name, float* x)
{
    if (!namemap) return;
    *x = henson::get<float>(namemap->get(name));
}